

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O3

void __thiscall
QArrayDataPointer<QCss::AnimationRule::AnimationRuleSet>::~QArrayDataPointer
          (QArrayDataPointer<QCss::AnimationRule::AnimationRuleSet> *this)

{
  Data *pDVar1;
  AnimationRuleSet *pAVar2;
  long lVar3;
  
  pDVar1 = this->d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      if (this->size != 0) {
        pAVar2 = this->ptr;
        lVar3 = this->size << 5;
        do {
          QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer(&(pAVar2->declarations).d);
          pAVar2 = (AnimationRuleSet *)(&pAVar2->declarations + 1);
          lVar3 = lVar3 + -0x20;
        } while (lVar3 != 0);
      }
      QArrayData::deallocate(&this->d->super_QArrayData,0x20,0x10);
      return;
    }
  }
  return;
}

Assistant:

bool deref() noexcept { return !d || d->deref(); }